

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiTextFilter::Draw(ImGuiTextFilter *this,char *label,float width)

{
  bool bVar1;
  void *in_RDI;
  float in_XMM0_Da;
  ImGuiTextFilter *unaff_retaddr;
  ImGuiInputTextFlags in_stack_0000000c;
  undefined4 in_stack_00000010;
  bool value_changed;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    ImGui::PushItemWidth((float)((ulong)in_RDI >> 0x20));
  }
  bVar1 = ImGui::InputText(this->InputBuf,label,CONCAT44(width,in_stack_00000010),in_stack_0000000c,
                           (ImGuiInputTextCallback)unaff_retaddr,in_RDI);
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    ImGui::PopItemWidth();
  }
  if (bVar1) {
    Build(unaff_retaddr);
  }
  return bVar1;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::PushItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (width != 0.0f)
        ImGui::PopItemWidth();
    if (value_changed)
        Build();
    return value_changed;
}